

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::TimingControlSyntax::isKind(SyntaxKind kind)

{
  if ((((0x14 < kind - CycleDelay) || ((0x180001U >> (kind - CycleDelay & 0x1f) & 1) == 0)) &&
      ((0x36 < kind - EventControl ||
       ((0x40000000000003U >> ((ulong)(kind - EventControl) & 0x3f) & 1) == 0)))) &&
     ((kind != OneStepDelay && (kind != RepeatedEventControl)))) {
    return false;
  }
  return true;
}

Assistant:

bool TimingControlSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::CycleDelay:
        case SyntaxKind::Delay3:
        case SyntaxKind::DelayControl:
        case SyntaxKind::EventControl:
        case SyntaxKind::EventControlWithExpression:
        case SyntaxKind::ImplicitEventControl:
        case SyntaxKind::OneStepDelay:
        case SyntaxKind::RepeatedEventControl:
            return true;
        default:
            return false;
    }
}